

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Choice.cpp
# Opt level: O0

VirtualIterator<Kernel::Clause_*> __thiscall
Inferences::Choice::ResultFn::operator()(ResultFn *this,Term *term)

{
  SingletonIterator<Kernel::Clause_*> it;
  bool bVar1;
  TermList *pTVar2;
  Clause *pCVar3;
  Term *in_RDX;
  IteratorCore<Kernel::Clause_*> *in_RDI;
  Clause *axiom;
  TermList op;
  TermList in_stack_00000178;
  TermList in_stack_00000180;
  TermList *in_stack_ffffffffffffff30;
  AxiomsIterator *this_00;
  AxiomsIterator *in_stack_ffffffffffffffb8;
  Term *in_stack_ffffffffffffffd8;
  
  pTVar2 = Kernel::Term::nthArgument(in_RDX,2);
  this_00 = (AxiomsIterator *)pTVar2->_content;
  bVar1 = Kernel::TermList::isVar(in_stack_ffffffffffffff30);
  if (bVar1) {
    AxiomsIterator::AxiomsIterator(this_00,in_stack_ffffffffffffffd8);
    Lib::pvi<Inferences::Choice::AxiomsIterator>(in_stack_ffffffffffffffb8);
    AxiomsIterator::~AxiomsIterator((AxiomsIterator *)0x792cee);
  }
  else {
    Kernel::Term::nthArgument(in_RDX,3);
    pCVar3 = createChoiceAxiom(in_stack_00000180,in_stack_00000178);
    *(int *)(DAT_01333840 + 0x108) = *(int *)(DAT_01333840 + 0x108) + 1;
    Lib::getSingletonIterator<Kernel::Clause*>((Clause *)0x792d6f);
    it._el = pCVar3;
    it._0_8_ = this_00;
    Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(it);
  }
  return (VirtualIterator<Kernel::Clause_*>)in_RDI;
}

Assistant:

VirtualIterator<Clause*> operator() (Term* term){
    TermList op = *term->nthArgument(2);
    if(op.isVar()){
      return pvi(AxiomsIterator(term));
    } else {
      Clause* axiom = createChoiceAxiom(op, *term->nthArgument(3));
      env.statistics->choiceInstances++;
      return pvi(getSingletonIterator(axiom));
    }
  }